

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

void dumb_it_set_resampling_quality(DUMB_IT_SIGRENDERER *sigrenderer,int quality)

{
  long lVar1;
  int in_ESI;
  long in_RDI;
  IT_PLAYING *playing_1;
  IT_PLAYING *playing;
  int i;
  int in_stack_ffffffffffffffdc;
  void *in_stack_ffffffffffffffe0;
  void *_r;
  int local_10;
  
  if (((in_RDI != 0) && (-1 < in_ESI)) && (in_ESI < 8)) {
    *(int *)(in_RDI + 0xc) = in_ESI;
    for (local_10 = 0; local_10 < 0x40; local_10 = local_10 + 1) {
      if (*(long *)(in_RDI + (long)local_10 * 0xa0 + 0xa8) != 0) {
        lVar1 = *(long *)(in_RDI + (long)local_10 * 0xa0 + 0xa8);
        *(int *)(lVar1 + 4) = in_ESI;
        *(int *)(lVar1 + 0xe0) = in_ESI;
        resampler_set_quality(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
        resampler_set_quality(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
      }
    }
    for (local_10 = 0; local_10 < 0xc0; local_10 = local_10 + 1) {
      if (*(long *)(in_RDI + 0x2820 + (long)local_10 * 8) != 0) {
        _r = *(void **)(in_RDI + 0x2820 + (long)local_10 * 8);
        *(int *)((long)_r + 4) = in_ESI;
        *(int *)((long)_r + 0xe0) = in_ESI;
        resampler_set_quality(_r,in_stack_ffffffffffffffdc);
        resampler_set_quality(_r,in_stack_ffffffffffffffdc);
      }
    }
  }
  return;
}

Assistant:

void DUMBEXPORT dumb_it_set_resampling_quality(DUMB_IT_SIGRENDERER * sigrenderer, int quality)
{
	if (sigrenderer && quality >= 0 && quality < DUMB_RQ_N_LEVELS)
	{
		int i;
		sigrenderer->resampling_quality = quality;
		for (i = 0; i < DUMB_IT_N_CHANNELS; i++) {
			if (sigrenderer->channel[i].playing)
			{
				IT_PLAYING * playing = sigrenderer->channel[i].playing;
				playing->resampling_quality = quality;
				playing->resampler.quality = quality;
				resampler_set_quality(playing->resampler.fir_resampler[0], quality - DUMB_RESAMPLER_BASE);
				resampler_set_quality(playing->resampler.fir_resampler[1], quality - DUMB_RESAMPLER_BASE);
			}
		}
		for (i = 0; i < DUMB_IT_N_NNA_CHANNELS; i++) {
			if (sigrenderer->playing[i]) {
				IT_PLAYING * playing = sigrenderer->playing[i];
				playing->resampling_quality = quality;
				playing->resampler.quality = quality;
				resampler_set_quality(playing->resampler.fir_resampler[0], quality - DUMB_RESAMPLER_BASE);
				resampler_set_quality(playing->resampler.fir_resampler[1], quality - DUMB_RESAMPLER_BASE);
			}
		}
	}
}